

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O2

uv_pipe_ptr __thiscall anon_unknown.dwarf_41914f::ImplPosix::OpenFD(ImplPosix *this,int fd)

{
  int __fd;
  int iVar1;
  uv_pipe_s *handle;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  uv_pipe_ptr uVar3;
  
  (this->super_Impl)._vptr_Impl = (_func_int **)0x0;
  (this->super_Impl).Loop = (uv_loop_t *)0x0;
  __fd = dup(in_EDX);
  _Var2._M_pi = extraout_RDX;
  if (-1 < __fd) {
    iVar1 = fcntl(__fd,2,1);
    if (iVar1 != -1) {
      ::cm::uv_pipe_ptr::init
                ((uv_pipe_ptr *)this,*(EVP_PKEY_CTX **)(CONCAT44(in_register_00000034,fd) + 8));
      handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_((uv_handle_ptr_<uv_pipe_s> *)this);
      iVar1 = uv_pipe_open(handle,__fd);
      _Var2._M_pi = extraout_RDX_00;
      if (-1 < iVar1) goto LAB_00210951;
    }
    close(__fd);
    _Var2._M_pi = extraout_RDX_01;
  }
LAB_00210951:
  uVar3.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  uVar3.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (uv_pipe_ptr)
         uVar3.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
         super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cm::uv_pipe_ptr ImplPosix::OpenFD(int fd)
{
  // Create a CLOEXEC duplicate so `uv_pipe_ptr` can close it
  // without closing the original file descriptor, which our
  // child processes might want to use too.
  cm::uv_pipe_ptr p;
  int fd_dup = dup(fd);
  if (fd_dup < 0) {
    return p;
  }
  if (fcntl(fd_dup, F_SETFD, FD_CLOEXEC) == -1) {
    close(fd_dup);
    return p;
  }
  p.init(this->Loop, 0, this);
  if (uv_pipe_open(p, fd_dup) < 0) {
    close(fd_dup);
  }
  return p;
}